

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::Session::Session(Session *this)

{
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *peVar4;
  int iVar5;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar6;
  undefined4 extraout_var;
  undefined8 uVar8;
  undefined **ppuVar9;
  Colour colourGuard;
  _func_int *local_d0;
  vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_> local_c8;
  Parser local_a8;
  _func_int **local_48;
  SourceLineInfo local_40;
  long *plVar7;
  
  (this->m_cli).super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001fa718;
  ppuVar9 = &PTR__ExeName_001f90c0;
  (this->m_cli).m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
  _vptr_ParserBase = (_func_int **)&PTR__ExeName_001f90c0;
  __p = &(this->m_cli).m_exeName.m_name;
  (this->m_cli).m_exeName.m_name.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  this_00 = &(this->m_cli).m_exeName.m_name.
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::__cxx11::string,std::allocator<std::__cxx11::string>,char_const(&)[13]>
            (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)__p,
             (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a8,(char (*) [13])"<executable>");
  (this->m_cli).m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cli).m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cli).m_options.super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_cli).m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cli).m_options.super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cli).m_options.super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cli).m_exeName.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_cli).m_exeName.m_ref.
  super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ConfigData::ConfigData(&this->m_configData);
  (this->m_config).m_ptr = (Config *)0x0;
  this->m_startupExceptions = false;
  if (Session()::alreadyInstantiated == '\x01') {
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)&local_c8);
    local_40.file =
         "/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/tests/catch_amalgamated.cpp"
    ;
    local_40.line = 0x380;
    operator<<((ostream *)
               local_c8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_40);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               local_c8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
               _M_impl.super__Vector_impl_data._M_finish,": Internal Catch2 error: ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               local_c8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               "Only one instance of Catch::Session can ever be used",0x34);
    std::__cxx11::stringbuf::str();
    throw_logic_error((string *)&local_a8);
  }
  do {
    pSVar6 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    iVar5 = (*(pSVar6->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[6])(pSVar6);
    plVar7 = (long *)CONCAT44(extraout_var,iVar5);
    if (*plVar7 == plVar7[1]) {
LAB_0017da2f:
      Session()::alreadyInstantiated = '\x01';
      makeCommandLineParser(&local_a8,&this->m_configData);
      _Var3._M_pi = local_a8.m_exeName.m_name.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      peVar2 = local_a8.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_a8.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_a8.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = this_00->_M_pi;
      (__p->
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = peVar2;
      (this->m_cli).m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = _Var3._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      _Var3._M_pi = local_a8.m_exeName.m_ref.
                    super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
      peVar4 = local_a8.m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_a8.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      local_a8.m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = (this->m_cli).m_exeName.m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (this->m_cli).m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = peVar4;
      (this->m_cli).m_exeName.m_ref.
      super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var3._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      local_c8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(this->m_cli).m_options.
                    super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
      (this->m_cli).m_options.
      super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_a8.m_options.
           super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_c8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(this->m_cli).m_options.
                    super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      local_c8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(this->m_cli).m_options.
                    super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
      (this->m_cli).m_options.
      super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_a8.m_options.
           super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
           super__Vector_impl_data._M_start;
      (this->m_cli).m_options.
      super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_a8.m_options.
           super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_a8.m_options.super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.m_options.super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.m_options.super__Vector_base<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector
                ((vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_> *)&local_c8);
      local_c8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (this->m_cli).m_args.
           super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      (this->m_cli).m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_a8.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_c8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
      super__Vector_impl_data._M_start =
           (this->m_cli).m_args.
           super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_c8.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (this->m_cli).m_args.
           super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (this->m_cli).m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_a8.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (this->m_cli).m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_a8.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_a8.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.m_args.super__Vector_base<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_c8);
      local_a8.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_001fa718;
      std::vector<Catch::Clara::Arg,_std::allocator<Catch::Clara::Arg>_>::~vector(&local_a8.m_args);
      std::vector<Catch::Clara::Opt,_std::allocator<Catch::Clara::Opt>_>::~vector
                (&local_a8.m_options);
      local_a8.m_exeName.super_ComposableParserImpl<Catch::Clara::ExeName>.super_ParserBase.
      _vptr_ParserBase = (ParserBase)(ParserBase)ppuVar9;
      if (local_a8.m_exeName.m_ref.
          super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.m_exeName.m_ref.
                   super___shared_ptr<Catch::Clara::Detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_a8.m_exeName.m_name.
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.m_exeName.m_name.
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      return;
    }
    config(this);
    if (IMutableContext::currentContext == (undefined8 *)0x0) {
      IMutableContext::currentContext = (undefined8 *)operator_new(0x20);
      ppuVar9 = &PTR__Context_001fac60;
      *IMutableContext::currentContext = &PTR__Context_001fac60;
      IMutableContext::currentContext[1] = 0;
      IMutableContext::currentContext[2] = 0;
      IMutableContext::currentContext[3] = 0;
    }
    else {
      ppuVar9 = (undefined **)*IMutableContext::currentContext;
    }
    (*(code *)ppuVar9[7])(IMutableContext::currentContext,(this->m_config).m_ptr);
    this->m_startupExceptions = true;
    Colour::use(Red);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Errors occurred during startup!",0x1f);
    local_a8.super_ParserBase._vptr_ParserBase._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,(char *)&local_a8,1);
    ppuVar9 = (undefined **)*plVar7;
    local_48 = (_func_int **)plVar7[1];
    if ((_func_int **)ppuVar9 == local_48) {
      Colour::use(None);
      ppuVar9 = &PTR__ExeName_001f90c0;
      goto LAB_0017da2f;
    }
    local_d0 = (_func_int *)*ppuVar9;
    if (local_d0 != (_func_int *)0x0) {
      std::__exception_ptr::exception_ptr::_M_addref();
    }
    uVar8 = std::rethrow_exception((exception_ptr)&local_d0);
    if ((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_a8.super_ParserBase._vptr_ParserBase != &local_a8.m_exeName.m_name) {
      operator_delete(local_a8.super_ParserBase._vptr_ParserBase,
                      (ulong)((long)&((local_a8.m_exeName.m_name.
                                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->_M_dataplus)._M_p + 1));
    }
    ReusableStringStream::~ReusableStringStream((ReusableStringStream *)&local_c8);
    __cxa_begin_catch(uVar8);
    pSVar6 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
             ::getInternal();
    (*(pSVar6->super_RegistryHub).super_IMutableRegistryHub._vptr_IMutableRegistryHub[7])
              (&(pSVar6->super_RegistryHub).super_IMutableRegistryHub);
    __cxa_end_catch();
  } while( true );
}

Assistant:

Session::Session() {
        static bool alreadyInstantiated = false;
        if (alreadyInstantiated) {
            CATCH_TRY{ CATCH_INTERNAL_ERROR("Only one instance of Catch::Session can ever be used"); }
            CATCH_CATCH_ALL{ getMutableRegistryHub().registerStartupException(); }